

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_update_fg_30_var
               (int len,secp256k1_modinv32_signed30 *f,secp256k1_modinv32_signed30 *g,
               secp256k1_modinv32_trans2x2 *t)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar6;
  ulong uVar7;
  long lVar8;
  secp256k1_modinv32_signed30 *psVar9;
  int iVar10;
  secp256k1_modinv32_signed30 *psVar11;
  int extraout_EDX;
  uint uVar12;
  uint uVar13;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint *extraout_RDX;
  int32_t *piVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b;
  ulong uVar16;
  long *extraout_RDX_00;
  long unaff_RBX;
  uint64_t uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  secp256k1_fe *psVar21;
  ulong uVar22;
  secp256k1_fe *r;
  undefined4 in_register_0000003c;
  secp256k1_modinv32_signed30 *a_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar23;
  ulong uVar24;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar25;
  uchar *__s;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  secp256k1_modinv32_signed30 *psVar34;
  ulong uVar35;
  uint uVar36;
  secp256k1_modinv32_signed30 *psVar37;
  uint64_t uVar38;
  size_t count;
  uint64_t uVar39;
  secp256k1_fe *a_02;
  uint uVar40;
  uint64_t uVar41;
  code *pcVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uStack_1318;
  secp256k1_fe *psStack_1310;
  uchar auStack_1308 [4232];
  secp256k1_fe *psStack_280;
  ulong uStack_278;
  uint64_t uStack_270;
  secp256k1_fe *psStack_268;
  code *pcStack_260;
  code *pcStack_258;
  undefined1 auStack_250 [36];
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  undefined1 auStack_210 [48];
  code *pcStack_1e0;
  long lStack_1d0;
  secp256k1_fe sStack_1c8;
  secp256k1_fe *psStack_190;
  secp256k1_fe sStack_188;
  secp256k1_fe sStack_158;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  secp256k1_modinv32_signed30 *psStack_108;
  ulong uStack_100;
  code *pcStack_f8;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  secp256k1_modinv32_signed30 *psStack_d8;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  int32_t iStack_bc;
  secp256k1_modinv32_signed30 *psStack_b8;
  secp256k1_modinv32_signed30 *psStack_b0;
  secp256k1_modinv32_signed30 *psStack_a8;
  secp256k1_modinv32_signed30 *psStack_a0;
  secp256k1_modinv32_signed30 *psStack_98;
  code *pcStack_90;
  long lStack_80;
  long lStack_78;
  long lStack_70;
  
  a_00 = (secp256k1_modinv32_signed30 *)CONCAT44(in_register_0000003c,len);
  if (len < 1) {
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014b8cd:
    iVar10 = (int)t;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar3 = t->v;
    iVar1 = t->u;
    unaff_RBX = (long)f->v[0];
    uVar7 = (long)g->v[0] * (long)iVar3 + unaff_RBX * iVar1;
    if ((uVar7 & 0x3fffffff) != 0) goto LAB_0014b8cd;
    iVar2 = t->r;
    iVar10 = t->q;
    unaff_RBX = unaff_RBX * iVar10;
    uVar30 = (long)g->v[0] * (long)iVar2 + unaff_RBX;
    if ((uVar30 & 0x3fffffff) == 0) {
      lVar31 = (long)uVar30 >> 0x1e;
      lVar8 = (long)uVar7 >> 0x1e;
      if (len != 1) {
        uVar7 = 1;
        do {
          lVar8 = (long)g->v[uVar7] * (long)iVar3 + (long)f->v[uVar7] * (long)iVar1 + lVar8;
          lVar31 = (long)g->v[uVar7] * (long)iVar2 + (long)f->v[uVar7] * (long)iVar10 + lVar31;
          f->v[uVar7 - 1] = (uint)lVar8 & 0x3fffffff;
          g->v[uVar7 - 1] = (uint)lVar31 & 0x3fffffff;
          uVar7 = uVar7 + 1;
          lVar31 = lVar31 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while ((uint)len != uVar7);
      }
      f->v[(long)len + -1] = (int32_t)lVar8;
      g->v[(long)len + -1] = (int32_t)lVar31;
      return;
    }
  }
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psVar9 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psVar9 = (secp256k1_modinv32_signed30 *)((long)psVar9->v + (long)f->v[lVar8] * (long)iVar10);
    }
    a_00->v[lVar8] = (uint)psVar9 & 0x3fffffff;
    psVar9 = (secp256k1_modinv32_signed30 *)((long)psVar9 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psVar9 = (secp256k1_modinv32_signed30 *)((long)psVar9->v + (long)f->v[8] * (long)iVar10);
  }
  psVar11 = (secp256k1_modinv32_signed30 *)(long)(int)psVar9;
  if (psVar11 == psVar9) {
    a_00->v[8] = (int)psVar9;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar19 = *extraout_RDX;
  psVar37 = (secp256k1_modinv32_signed30 *)(long)(int)uVar19;
  uVar13 = extraout_RDX[1];
  lVar8 = (long)(int)uVar13;
  uVar20 = extraout_RDX[2];
  psVar9 = (secp256k1_modinv32_signed30 *)(long)(int)uVar20;
  lStack_80 = (long)(int)extraout_RDX[3];
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_90 = (code *)0x14b96c;
  a_01 = a_00;
  lStack_70 = unaff_RBX;
  iVar3 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar11,-2);
  if (iVar3 < 1) {
    pcStack_90 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_90 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_90 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_90 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_90 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_90 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_90 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_90 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar34 = psVar11;
LAB_0014bbf7:
    pcStack_90 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_90 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_90 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14b989;
    a_01 = a_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar11,1);
    if (-1 < iVar3) goto LAB_0014bbd4;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14b9a6;
    a_01 = f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(f,9,psVar11,-2);
    if (iVar3 < 1) goto LAB_0014bbd9;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14b9c3;
    a_01 = f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(f,9,psVar11,1);
    if (-1 < iVar3) goto LAB_0014bbde;
    psVar34 = (secp256k1_modinv32_signed30 *)-(long)psVar37;
    if (0 < (long)psVar37) {
      psVar34 = psVar37;
    }
    lVar31 = -lVar8;
    if (lVar8 < 1) {
      lVar31 = lVar8;
    }
    if (lVar31 + 0x40000000 < (long)psVar34) goto LAB_0014bbe3;
    psVar34 = (secp256k1_modinv32_signed30 *)-(long)psVar9;
    if (0 < (long)psVar9) {
      psVar34 = psVar9;
    }
    lVar31 = -lStack_80;
    if (lStack_80 < 1) {
      lVar31 = lStack_80;
    }
    if (lVar31 + 0x40000000 < (long)psVar34) goto LAB_0014bbe8;
    uVar26 = a_00->v[8] >> 0x1f;
    uVar18 = f->v[8] >> 0x1f;
    psVar21 = (secp256k1_fe *)(ulong)uVar18;
    iVar3 = (uVar18 & uVar13) + (uVar26 & uVar19);
    a_01 = (secp256k1_modinv32_signed30 *)(f->v[0] * lVar8 + (long)a_00->v[0] * (long)psVar37);
    lVar31 = (long)(int)(iVar3 - ((int)a_01 * psVar11[1].v[0] + iVar3 & 0x3fffffffU));
    piVar14 = (int32_t *)((long)a_01->v + lVar31 * psVar11->v[0]);
    if (((ulong)piVar14 & 0x3fffffff) != 0) goto LAB_0014bbed;
    iVar3 = (uVar18 & (uint)lStack_80) + (uVar26 & uVar20);
    lVar32 = f->v[0] * lStack_80 + (long)a_00->v[0] * (long)psVar9;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar19 = iVar3 - (psVar11[1].v[0] * (int)lVar32 + iVar3 & 0x3fffffffU);
    psVar21 = (secp256k1_fe *)(ulong)uVar19;
    uVar7 = (long)psVar11->v[0] * (long)(int)uVar19 + lVar32;
    lStack_78 = lVar31;
    if ((uVar7 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar32 = (long)uVar7 >> 0x1e;
    lVar15 = (long)piVar14 >> 0x1e;
    lVar23 = 1;
    do {
      lVar15 = psVar11->v[lVar23] * lVar31 + f->v[lVar23] * lVar8 +
               (long)a_00->v[lVar23] * (long)psVar37 + lVar15;
      psVar34 = (secp256k1_modinv32_signed30 *)(f->v[lVar23] * lStack_80);
      lVar32 = (long)psVar34->v +
               (long)a_00->v[lVar23] * (long)psVar9 + lVar32 +
               (long)psVar11->v[lVar23] * (long)(int)uVar19;
      a_00->v[lVar23 + -1] = (uint)lVar15 & 0x3fffffff;
      f->v[lVar23 + -1] = (uint)lVar32 & 0x3fffffff;
      lVar23 = lVar23 + 1;
      lVar32 = lVar32 >> 0x1e;
      lVar15 = lVar15 >> 0x1e;
    } while (lVar23 != 9);
    a_00->v[8] = (int32_t)lVar15;
    f->v[8] = (int32_t)lVar32;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14bb6d;
    a_01 = a_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar11,-2);
    psVar9 = f;
    psVar37 = psVar11;
    if (iVar3 < 1) goto LAB_0014bbf7;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14bb8a;
    a_01 = a_00;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar11,1);
    if (-1 < iVar3) goto LAB_0014bbfc;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14bba3;
    a_01 = f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(f,9,psVar11,-2);
    if (iVar3 < 1) goto LAB_0014bc01;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x14bbbc;
    a_01 = f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(f,9,psVar11,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_90 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar19 = a_01->v[0];
  uVar22 = (ulong)uVar19;
  uVar13 = a_01->v[3];
  uVar16 = (ulong)uVar13;
  uVar20 = a_01->v[4];
  uVar30 = (ulong)uVar20;
  uVar18 = a_01->v[5];
  uVar35 = (ulong)uVar18;
  psVar11 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar26 = a_01->v[7];
  uVar7 = (ulong)uVar26;
  iStack_bc = a_01->v[8];
  lVar31 = 0;
  do {
    psStack_b8 = psVar9;
    psStack_b0 = psVar34;
    psStack_a8 = psVar37;
    psStack_a0 = f;
    psStack_98 = a_00;
    pcStack_90 = (code *)lVar8;
    if (a_01->v[lVar31] < -0x3fffffff) {
      pcStack_f8 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_f8 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_01->v[lVar31]) goto LAB_0014bf54;
    lVar31 = lVar31 + 1;
  } while (lVar31 != 9);
  uStack_dc = (uint)psVar21;
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_f8 = (code *)0x14bc91;
  psVar11 = a_01;
  uStack_e8 = a_01->v[1];
  uStack_e4 = a_01->v[2];
  uStack_e0 = a_01->v[6];
  psStack_d8 = b;
  iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar3 < 1) {
LAB_0014bf59:
    pcStack_f8 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_f8 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_f8 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_f8 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x14bcb0;
    psVar11 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,1);
    if (-1 < iVar3) goto LAB_0014bf5e;
    uVar4 = iStack_bc >> 0x1f;
    uStack_c0 = psStack_d8->v[1];
    uVar5 = (uVar4 & uStack_c0) + uStack_e8;
    uStack_e8 = psStack_d8->v[2];
    uVar12 = (uVar4 & uStack_e8) + uStack_e4;
    uStack_e4 = psStack_d8->v[3];
    uStack_c4 = psStack_d8->v[4];
    uStack_c8 = psStack_d8->v[5];
    uStack_cc = psStack_d8->v[6];
    uVar36 = (uVar4 & uStack_cc) + uStack_e0;
    uStack_e0 = psStack_d8->v[7];
    uStack_ec = (int)uStack_dc >> 0x1f;
    uStack_dc = psStack_d8->v[8];
    uVar29 = ((uVar4 & psStack_d8->v[0]) + uVar19 ^ uStack_ec) - uStack_ec;
    uVar27 = ((int)uVar29 >> 0x1e) + ((uVar5 ^ uStack_ec) - uStack_ec);
    uVar5 = ((int)uVar27 >> 0x1e) + ((uVar12 ^ uStack_ec) - uStack_ec);
    uVar40 = ((int)uVar5 >> 0x1e) + (((uVar4 & uStack_e4) + uVar13 ^ uStack_ec) - uStack_ec);
    uVar13 = ((int)uVar40 >> 0x1e) + (((uVar4 & uStack_c4) + uVar20 ^ uStack_ec) - uStack_ec);
    uVar19 = ((int)uVar13 >> 0x1e) + (((uVar4 & uStack_c8) + uVar18 ^ uStack_ec) - uStack_ec);
    uVar20 = ((int)uVar19 >> 0x1e) + ((uVar36 ^ uStack_ec) - uStack_ec);
    uVar18 = ((int)uVar20 >> 0x1e) + (((uVar4 & uStack_e0) + uVar26 ^ uStack_ec) - uStack_ec);
    uVar33 = ((int)uVar18 >> 0x1e) + (((uVar4 & uStack_dc) + iStack_bc ^ uStack_ec) - uStack_ec);
    uVar35 = (ulong)uVar33;
    uStack_f0 = (int)uVar33 >> 0x1f;
    uVar36 = (psStack_d8->v[0] & uStack_f0) + (uVar29 & 0x3fffffff);
    uVar12 = (uStack_c8 & uStack_f0) + (uVar19 & 0x3fffffff);
    uVar22 = (ulong)uVar12;
    uVar29 = (uStack_cc & uStack_f0) + (uVar20 & 0x3fffffff);
    uVar16 = (ulong)uVar29;
    uVar19 = ((int)uVar36 >> 0x1e) + (uStack_c0 & uStack_f0) + (uVar27 & 0x3fffffff);
    uVar20 = ((int)uVar19 >> 0x1e) + (uStack_e8 & uStack_f0) + (uVar5 & 0x3fffffff);
    uVar26 = ((int)uVar20 >> 0x1e) + (uStack_e4 & uStack_f0) + (uVar40 & 0x3fffffff);
    uVar4 = ((int)uVar26 >> 0x1e) + (uStack_c4 & uStack_f0) + (uVar13 & 0x3fffffff);
    uVar12 = ((int)uVar4 >> 0x1e) + uVar12;
    uVar29 = ((int)uVar12 >> 0x1e) + uVar29;
    uVar13 = ((int)uVar29 >> 0x1e) + (uStack_e0 & uStack_f0) + (uVar18 & 0x3fffffff);
    uVar18 = ((int)uVar13 >> 0x1e) + (uStack_dc & uStack_f0) + uVar33;
    uVar30 = (ulong)uVar18;
    uVar26 = uVar26 & 0x3fffffff;
    psVar21 = (secp256k1_fe *)(ulong)uVar26;
    uVar4 = uVar4 & 0x3fffffff;
    psVar11 = (secp256k1_modinv32_signed30 *)(ulong)uVar4;
    uVar13 = uVar13 & 0x3fffffff;
    uVar7 = (ulong)uVar13;
    a_01->v[0] = uVar36 & 0x3fffffff;
    a_01->v[1] = uVar19 & 0x3fffffff;
    a_01->v[2] = uVar20 & 0x3fffffff;
    a_01->v[3] = uVar26;
    a_01->v[4] = uVar4;
    a_01->v[5] = uVar12 & 0x3fffffff;
    a_01->v[6] = uVar29 & 0x3fffffff;
    a_01->v[7] = uVar13;
    a_01->v[8] = uVar18;
    if (0x3fffffff < uVar18) goto LAB_0014bf63;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x14bf21;
    psVar11 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,0);
    if (iVar3 < 0) goto LAB_0014bf68;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x14bf3c;
    psVar11 = a_01;
    iVar3 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_f8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_190 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_190 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_1e0 = (code *)0x14bfa9;
  uStack_120 = uVar7;
  uStack_118 = uVar35;
  uStack_110 = uVar16;
  psStack_108 = a_01;
  uStack_100 = uVar22;
  pcStack_f8 = (code *)uVar30;
  (*(code *)psStack_190)(&sStack_1c8);
  if (psVar11 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar11->v + 8) = sStack_1c8.n[4];
    *(ulong *)(psVar11[1].v + 1) = CONCAT44(sStack_1c8.normalized,sStack_1c8.magnitude);
    *(uint64_t *)(psVar11->v + 4) = sStack_1c8.n[2];
    *(uint64_t *)(psVar11->v + 6) = sStack_1c8.n[3];
    *(uint64_t *)psVar11->v = sStack_1c8.n[0];
    *(uint64_t *)(psVar11->v + 2) = sStack_1c8.n[1];
  }
  uVar41 = 0xfffffffffffff;
  uVar38 = 0xf000000000000;
  uVar30 = 0xffffffffffff;
  uVar35 = 0x1000003d0;
  sStack_158.n[0] = psVar21->n[0];
  sStack_158.n[1] = psVar21->n[1];
  sStack_158.n[2] = psVar21->n[2];
  sStack_158.n[3] = psVar21->n[3];
  sStack_158.n[4] = psVar21->n[4];
  sStack_158.magnitude = psVar21->magnitude;
  sStack_158.normalized = psVar21->normalized;
  a_02 = &sStack_158;
  pcStack_1e0 = (code *)0x14c020;
  secp256k1_fe_verify(a_02);
  lStack_1d0 = 0x1000003d1;
  uVar7 = (sStack_158.n[4] >> 0x30) * 0x1000003d1 + sStack_158.n[0];
  if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar7 >> 0x34) + sStack_158.n[1];
    uVar22 = (uVar16 >> 0x34) + sStack_158.n[2];
    uVar24 = (uVar22 >> 0x34) + sStack_158.n[3];
    uVar28 = (uVar24 >> 0x34) + (sStack_158.n[4] & 0xffffffffffff);
    if ((((uVar16 | uVar7 | uVar22 | uVar24) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
       (((uVar7 | 0x1000003d0) & uVar16 & uVar22 & uVar24 & (uVar28 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar21 = &sStack_1c8;
    pcStack_1e0 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar21);
    uVar30 = uVar30 & sStack_1c8.n[4];
    uVar7 = (sStack_1c8.n[4] >> 0x30) * lStack_1d0 + sStack_1c8.n[0];
    uVar16 = (uVar7 >> 0x34) + sStack_1c8.n[1];
    uVar22 = (uVar16 >> 0x34) + sStack_1c8.n[2];
    r = (secp256k1_fe *)((uVar22 >> 0x34) + sStack_1c8.n[3]);
    uVar24 = ((ulong)r >> 0x34) + uVar30;
    if ((((uVar16 | uVar7 | uVar22 | (ulong)r) & uVar41) == 0 && uVar24 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar24 ^ uVar38),
       ((uVar7 ^ uVar35) & uVar16 & uVar22 & (ulong)r & (ulong)r_00) == uVar41)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_1e0 = (code *)0x14c0db;
    r = psVar21;
    secp256k1_fe_mul(&sStack_158,psVar21,&sStack_1c8);
    pcStack_1e0 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_158);
    r_00 = &fe_minus_one;
    pcStack_1e0 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_158.magnitude < 0x20) {
      sStack_158.n[0] = sStack_158.n[0] + 0xffffefffffc2e;
      sStack_158.n[1] = sStack_158.n[1] + 0xfffffffffffff;
      sStack_158.n[2] = sStack_158.n[2] + 0xfffffffffffff;
      sStack_158.n[3] = sStack_158.n[3] + 0xfffffffffffff;
      sStack_158.n[4] = sStack_158.n[4] + 0xffffffffffff;
      sStack_158.normalized = 0;
      sStack_158.magnitude = sStack_158.magnitude + 1;
      pcStack_1e0 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_158);
      pcStack_1e0 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_158);
      uVar7 = (sStack_158.n[4] >> 0x30) * lStack_1d0 + sStack_158.n[0];
      uVar30 = (uVar7 >> 0x34) + sStack_158.n[1];
      uVar16 = (uVar30 >> 0x34) + sStack_158.n[2];
      r = (secp256k1_fe *)((uVar16 >> 0x34) + sStack_158.n[3]);
      uVar22 = ((ulong)r >> 0x34) + (sStack_158.n[4] & 0xffffffffffff);
      if ((((uVar30 | uVar7 | uVar16 | (ulong)r) & 0xfffffffffffff) != 0 || uVar22 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar22 ^ 0xf000000000000),
         ((uVar7 ^ 0x1000003d0) & uVar30 & uVar16 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_188.n[0] = psVar21->n[0];
      sStack_188.n[1] = psVar21->n[1];
      sStack_188.n[2] = psVar21->n[2];
      sStack_188.n[3] = psVar21->n[3];
      sStack_188.n[4] = psVar21->n[4];
      sStack_188.magnitude = psVar21->magnitude;
      sStack_188.normalized = psVar21->normalized;
      psVar21 = &sStack_188;
      pcStack_1e0 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar21);
      r_00 = &fe_minus_one;
      pcStack_1e0 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_188.magnitude) goto LAB_0014c56a;
      uVar17 = sStack_188.n[0] + 0xffffefffffc2e;
      uVar39 = sStack_188.n[1] + 0xfffffffffffff;
      uVar41 = sStack_188.n[2] + 0xfffffffffffff;
      uVar38 = sStack_188.n[3] + 0xfffffffffffff;
      uVar35 = sStack_188.n[4] + 0xffffffffffff;
      sStack_188.normalized = 0;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      pcStack_1e0 = (code *)0x14c265;
      sStack_188.n[0] = uVar17;
      sStack_188.n[1] = uVar39;
      sStack_188.n[2] = uVar41;
      sStack_188.n[3] = uVar38;
      sStack_188.n[4] = uVar35;
      secp256k1_fe_verify(&sStack_188);
      pcStack_1e0 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_188);
      a_02 = psStack_190;
      uVar7 = (uVar35 >> 0x30) * lStack_1d0 + uVar17;
      if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
        uVar35 = uVar35 & 0xffffffffffff;
        uVar24 = uVar39 + (uVar7 >> 0x34);
        uVar30 = (uVar24 >> 0x34) + uVar41;
        uVar16 = (uVar30 >> 0x34) + uVar38;
        uVar22 = (uVar16 >> 0x34) + uVar35;
        if (((uVar24 | uVar7 | uVar30 | uVar16) & 0xfffffffffffff) == 0 && uVar22 == 0) {
          return;
        }
        if (((uVar7 | 0x1000003d0) & uVar24 & uVar30 & uVar16 & (uVar22 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_188;
      pcStack_1e0 = (code *)0x14c32d;
      (*(code *)psStack_190)();
      psVar21 = &sStack_1c8;
      pcStack_1e0 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar21);
      r_00 = &fe_minus_one;
      pcStack_1e0 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_1c8.magnitude) goto LAB_0014c56f;
      psVar21 = &sStack_1c8;
      sStack_1c8.n[0] = sStack_1c8.n[0] + 0xffffefffffc2e;
      sStack_1c8.n[1] = sStack_1c8.n[1] + 0xfffffffffffff;
      sStack_1c8.n[2] = sStack_1c8.n[2] + 0xfffffffffffff;
      sStack_1c8.n[3] = sStack_1c8.n[3] + 0xfffffffffffff;
      sStack_1c8.n[4] = sStack_1c8.n[4] + 0xffffffffffff;
      sStack_1c8.magnitude = sStack_1c8.magnitude + 1;
      uVar30 = 0;
      sStack_1c8.normalized = 0;
      pcStack_1e0 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar21);
      pcStack_1e0 = (code *)0x14c398;
      r = psVar21;
      (*(code *)a_02)(psVar21);
      pcStack_1e0 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar21);
      sStack_1c8.n[0] = sStack_1c8.n[0] + 1;
      sStack_1c8.magnitude = sStack_1c8.magnitude + 1;
      sStack_1c8.normalized = 0;
      pcStack_1e0 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar21);
      pcStack_1e0 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar21);
      a_02 = &sStack_188;
      pcStack_1e0 = (code *)0x14c3c6;
      r_00 = a_02;
      secp256k1_fe_verify(a_02);
      if (sStack_188.magnitude + sStack_1c8.magnitude < 0x21) {
        sStack_1c8.n[0] = sStack_1c8.n[0] + sStack_188.n[0];
        sStack_1c8.n[1] = sStack_1c8.n[1] + sStack_188.n[1];
        sStack_1c8.n[2] = sStack_1c8.n[2] + sStack_188.n[2];
        sStack_1c8.n[3] = sStack_1c8.n[3] + sStack_188.n[3];
        sStack_1c8.n[4] = sStack_1c8.n[4] + sStack_188.n[4];
        sStack_1c8.normalized = 0;
        pcStack_1e0 = (code *)0x14c414;
        sStack_1c8.magnitude = sStack_188.magnitude + sStack_1c8.magnitude;
        secp256k1_fe_verify(&sStack_1c8);
        pcStack_1e0 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_1c8);
        uVar7 = (sStack_1c8.n[4] >> 0x30) * lStack_1d0 + sStack_1c8.n[0];
        if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
          uVar16 = (uVar7 >> 0x34) + sStack_1c8.n[1];
          uVar22 = (uVar16 >> 0x34) + sStack_1c8.n[2];
          uVar24 = (uVar22 >> 0x34) + sStack_1c8.n[3];
          uVar28 = (uVar24 >> 0x34) + (sStack_1c8.n[4] & 0xffffffffffff);
          if (((uVar16 | uVar7 | uVar22 | uVar24) & 0xfffffffffffff) == 0 && uVar28 == 0) {
            return;
          }
          if (((uVar7 | 0x1000003d0) & uVar16 & uVar22 & uVar24 & (uVar28 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1e0 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_1e0 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_1e0 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_02 = &sStack_158;
      pcStack_1e0 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar30 = 0xffffffffffff;
      pcStack_1e0 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_1e0 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_1e0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar25 = (secp256k1_fe *)auStack_250;
  pcVar42 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar42 = secp256k1_scalar_inverse;
  }
  pcStack_258 = (code *)0x14c5a7;
  auStack_210._32_8_ = psVar21;
  auStack_210._40_8_ = a_02;
  pcStack_1e0 = (code *)uVar41;
  (*pcVar42)(auStack_250);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_250._20_4_,auStack_250._16_4_);
    r_00->n[3] = CONCAT44(auStack_250._28_4_,auStack_250._24_4_);
    r_00->n[0] = CONCAT44(auStack_250._4_4_,auStack_250._0_4_);
    r_00->n[1] = CONCAT44(auStack_250._12_4_,auStack_250._8_4_);
  }
  pcStack_258 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar43._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar43._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar43._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar43._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar3 = movmskps(extraout_EAX,auVar43);
  if (iVar3 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_210;
    pcStack_258 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_250);
    pcStack_258 = (code *)0x14c602;
    psVar21 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_210._0_8_ != 1 || auStack_210._8_8_ != 0) || auStack_210._16_8_ != 0) ||
        auStack_210._24_8_ != 0) {
      pcStack_258 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_258 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_250 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_258 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_250 + 0x20));
    auVar44._0_4_ = -(uint)(iStack_220 == 0 && auStack_250._32_4_ == 0);
    auVar44._4_4_ = -(uint)(iStack_21c == 0 && iStack_22c == 0);
    auVar44._8_4_ = -(uint)(iStack_218 == 0 && iStack_228 == 0);
    auVar44._12_4_ = -(uint)(iStack_214 == 0 && iStack_224 == 0);
    iVar3 = movmskps(extraout_EAX_00,auVar44);
    if (iVar3 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_250 + 0x20);
    pcStack_258 = (code *)0x14c66b;
    (*pcVar42)(a,a);
    pcStack_258 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_250,&scalar_minus_one,(secp256k1_scalar *)auStack_250);
    pcStack_258 = (code *)0x14c689;
    (*pcVar42)(auStack_250,auStack_250);
    pcStack_258 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_250,(secp256k1_scalar *)auStack_250,&secp256k1_scalar_one
              );
    pcStack_258 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_250,a,(secp256k1_scalar *)auStack_250);
    pcStack_258 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_250);
    auVar45._0_4_ = -(uint)(auStack_250._16_4_ == 0 && auStack_250._0_4_ == 0);
    auVar45._4_4_ = -(uint)(auStack_250._20_4_ == 0 && auStack_250._4_4_ == 0);
    auVar45._8_4_ = -(uint)(auStack_250._24_4_ == 0 && auStack_250._8_4_ == 0);
    auVar45._12_4_ = -(uint)(auStack_250._28_4_ == 0 && auStack_250._12_4_ == 0);
    iVar3 = movmskps(extraout_EAX_01,auVar45);
    if (iVar3 == 0xf) {
      return;
    }
    pcStack_258 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_250;
  }
  pcStack_258 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_250);
  auVar46._0_4_ = -(uint)(auStack_250._16_4_ == 0 && auStack_250._0_4_ == 0);
  auVar46._4_4_ = -(uint)(auStack_250._20_4_ == 0 && auStack_250._4_4_ == 0);
  auVar46._8_4_ = -(uint)(auStack_250._24_4_ == 0 && auStack_250._8_4_ == 0);
  auVar46._12_4_ = -(uint)(auStack_250._28_4_ == 0 && auStack_250._12_4_ == 0);
  iVar3 = movmskps(extraout_EAX_02,auVar46);
  r = (secp256k1_fe *)auStack_250;
  psVar21 = psVar25;
  if (iVar3 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_258 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1308;
  psStack_280 = r;
  uStack_278 = uVar35;
  uStack_270 = uVar38;
  psStack_268 = r_00;
  pcStack_260 = pcVar42;
  pcStack_258 = (code *)uVar30;
  memset(__s,0,0x1081);
  uStack_1318 = 0;
  lVar8 = 0x41;
  psStack_1310 = psVar21;
  secp256k1_hsort(__s,0x41,(size_t)psVar21,test_hsort_cmp,&uStack_1318);
  if (0x3f < uStack_1318) {
    test_hsort_is_sorted(auStack_1308,0x41,(size_t)psVar21);
    if (0 < COUNT) {
      iVar3 = 0;
      do {
        uVar6 = testrand_int(0x41);
        count = (size_t)(int)uVar6;
        testrand_bytes_test(auStack_1308,count * (long)psVar21);
        secp256k1_hsort(auStack_1308,count,(size_t)psVar21,test_hsort_cmp,&uStack_1318);
        test_hsort_is_sorted(auStack_1308,count,(size_t)psVar21);
        iVar3 = iVar3 + 1;
      } while (iVar3 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_00 = *extraout_RDX_00 + 1;
  if (extraout_RDX_00[1] != 0) {
    lVar31 = 0;
    do {
      if (__s[lVar31] != *(uchar *)(lVar8 + lVar31)) {
        return;
      }
      lVar31 = lVar31 + 1;
    } while (extraout_RDX_00[1] != lVar31);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_update_fg_30_var(int len, secp256k1_modinv32_signed30 *f, secp256k1_modinv32_signed30 *g, const secp256k1_modinv32_trans2x2 *t) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t fi, gi;
    int64_t cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    cf = (int64_t)u * fi + (int64_t)v * gi;
    cg = (int64_t)q * fi + (int64_t)r * gi;
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cf & M30) == 0); cf >>= 30;
    VERIFY_CHECK(((int32_t)cg & M30) == 0); cg >>= 30;
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 30 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        cf += (int64_t)u * fi + (int64_t)v * gi;
        cg += (int64_t)q * fi + (int64_t)r * gi;
        f->v[i - 1] = (int32_t)cf & M30; cf >>= 30;
        g->v[i - 1] = (int32_t)cg & M30; cg >>= 30;
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = (int32_t)cf;
    g->v[len - 1] = (int32_t)cg;
}